

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

void * tlsio_openssl_CloneOption(char *name,void *value)

{
  undefined4 uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  OPTIONHANDLER_HANDLE pOVar4;
  int *piVar5;
  undefined4 *puVar6;
  char *pcVar7;
  void *result;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar7 = "invalid parameter detected: const char* name=%p, const void* value=%p";
    iVar2 = 0x67;
  }
  else {
    iVar2 = strcmp(name,"underlying_io_options");
    if (iVar2 == 0) {
      pOVar4 = OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
      return pOVar4;
    }
    iVar2 = strcmp(name,"TrustedCerts");
    if (iVar2 == 0) {
      iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
      if (iVar2 == 0) {
        return result;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar7 = "unable to mallocAndStrcpy_s TrustedCerts value";
      iVar2 = 0x74;
    }
    else {
      iVar2 = strcmp(name,"CipherSuite");
      if (iVar2 == 0) {
        iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
        if (iVar2 == 0) {
          return result;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (void *)0x0;
        }
        pcVar7 = "unable to mallocAndStrcpy_s CipherSuite value";
        iVar2 = 0x80;
      }
      else {
        iVar2 = strcmp(name,"x509certificate");
        if (iVar2 == 0) {
          iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
          if (iVar2 == 0) {
            return result;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return (void *)0x0;
          }
          pcVar7 = "unable to mallocAndStrcpy_s x509certificate value";
          iVar2 = 0x8c;
        }
        else {
          iVar2 = strcmp(name,"x509privatekey");
          if (iVar2 == 0) {
            iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
            if (iVar2 == 0) {
              return result;
            }
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return (void *)0x0;
            }
            pcVar7 = "unable to mallocAndStrcpy_s x509privatekey value";
            iVar2 = 0x98;
          }
          else {
            iVar2 = strcmp(name,"x509EccCertificate");
            if (iVar2 == 0) {
              iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
              if (iVar2 == 0) {
                return result;
              }
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return (void *)0x0;
              }
              pcVar7 = "unable to mallocAndStrcpy_s x509EccCertificate value";
              iVar2 = 0xa4;
            }
            else {
              iVar2 = strcmp(name,"x509EccAliasKey");
              if (iVar2 == 0) {
                iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
                if (iVar2 == 0) {
                  return result;
                }
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return (void *)0x0;
                }
                pcVar7 = "unable to mallocAndStrcpy_s x509EccKey value";
                iVar2 = 0xb0;
              }
              else {
                iVar2 = strcmp(name,"tls_version");
                if (iVar2 == 0) {
                  iVar2 = *value;
                  if (iVar2 - 10U < 3) {
                    piVar5 = (int *)malloc(4);
                    if (piVar5 != (int *)0x0) {
                      *piVar5 = iVar2;
                      return piVar5;
                    }
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return (void *)0x0;
                    }
                    pcVar7 = "Failed cloning tls_version option";
                    iVar2 = 0xd8;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return (void *)0x0;
                    }
                    pcVar7 = "Unexpected TLS version value (%d)";
                    iVar2 = 0xca;
                  }
LAB_0010c6f9:
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
                            ,"tlsio_openssl_CloneOption",iVar2,1,pcVar7);
                  return (void *)0x0;
                }
                iVar2 = strcmp(name,"tls_validation_callback");
                if (iVar2 == 0) {
                  return value;
                }
                iVar2 = strcmp(name,"tls_validation_callback_data");
                if (iVar2 == 0) {
                  return value;
                }
                iVar2 = strcmp(name,"Engine");
                if (iVar2 == 0) {
                  iVar2 = mallocAndStrcpy_s((char **)&result,(char *)value);
                  if (iVar2 == 0) {
                    return result;
                  }
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 == (LOGGER_LOG)0x0) {
                    return (void *)0x0;
                  }
                  pcVar7 = "unable to mallocAndStrcpy_s Engine value";
                  iVar2 = 0xed;
                }
                else {
                  iVar2 = strcmp(name,"x509PrivatekeyType");
                  if (iVar2 == 0) {
                    uVar1 = *value;
                    puVar6 = (undefined4 *)malloc(4);
                    if (puVar6 != (undefined4 *)0x0) {
                      *puVar6 = uVar1;
                      return puVar6;
                    }
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return (void *)0x0;
                    }
                    pcVar7 = "Failed cloning cert or private key option";
                    iVar2 = 0xfc;
                    goto LAB_0010c6f9;
                  }
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 == (LOGGER_LOG)0x0) {
                    return (void *)0x0;
                  }
                  pcVar7 = "not handled option : %s";
                  iVar2 = 0x107;
                }
              }
            }
          }
        }
      }
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
            ,"tlsio_openssl_CloneOption",iVar2,1,pcVar7);
  return (void *)0x0;
}

Assistant:

static void* tlsio_openssl_CloneOption(const char* name, const void* value)
{
    void* result;
    if (
        (name == NULL) || (value == NULL)
        )
    {
        LogError("invalid parameter detected: const char* name=%p, const void* value=%p", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(name, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
        }
        else if (strcmp(name, OPTION_TRUSTED_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s TrustedCerts value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_OPENSSL_CIPHER_SUITE) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s CipherSuite value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, SU_OPTION_X509_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509certificate value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, SU_OPTION_X509_PRIVATE_KEY) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509privatekey value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_X509_ECC_CERT) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509EccCertificate value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_X509_ECC_KEY) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509EccKey value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_TLS_VERSION) == 0)
        {
            int int_value;

            if (*(TLSIO_VERSION*)value == VERSION_1_0)
            {
                int_value = 10;
            }
            else if (*(TLSIO_VERSION*)value == VERSION_1_1)
            {
                int_value = 11;
            }
            else if (*(TLSIO_VERSION*)value == VERSION_1_2)
            {
                int_value = 12;
            }
            else
            {
                LogError("Unexpected TLS version value (%d)", *(int*)value);
                int_value = -1;
            }

            if (int_value < 0)
            {
                result = NULL;
            }
            else
            {
                int* value_clone;

                if ((value_clone = (int*)malloc(sizeof(int))) == NULL)
                {
                    LogError("Failed cloning tls_version option");
                }
                else
                {
                    *value_clone = int_value;
                }

                result = value_clone;
            }
        }
        else if (
            (strcmp(name, "tls_validation_callback") == 0) ||
            (strcmp(name, "tls_validation_callback_data") == 0)
            )
        {
            result = (void*)value;
        }
        else if (strcmp(name, OPTION_OPENSSL_ENGINE) == 0)
        {
            if (mallocAndStrcpy_s((char**)&result, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s Engine value");
                result = NULL;
            }
            else
            {
                /*return as is*/
            }
        }
        else if (strcmp(name, OPTION_OPENSSL_PRIVATE_KEY_TYPE) == 0)
        {
            OPTION_OPENSSL_KEY_TYPE key_type_value = *((OPTION_OPENSSL_KEY_TYPE*)value);
            OPTION_OPENSSL_KEY_TYPE* value_clone;

            if ((value_clone = (OPTION_OPENSSL_KEY_TYPE*)malloc(sizeof(OPTION_OPENSSL_KEY_TYPE))) == NULL)
            {
                LogError("Failed cloning cert or private key option");
            }
            else
            {
                *value_clone = key_type_value;
            }

            result = value_clone;
        }
        else
        {
            LogError("not handled option : %s", name);
            result = NULL;
        }
    }
    return result;
}